

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Node **ppNVar1;
  Lexer *pLVar2;
  bool bVar3;
  bool bVar4;
  Bool BVar5;
  int iVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  tmbstr ptVar10;
  Dict *pDVar11;
  Node **ppNVar12;
  Node *pNVar13;
  TidyTagId TVar14;
  uint uVar15;
  uint local_3c;
  
  uVar7 = element->tag->model;
  if ((uVar7 & 1) != 0) {
    return;
  }
  pLVar2 = doc->lexer;
  if (element->tag->id == TidyTag_FORM) {
    for (pNVar13 = element->parent; pNVar13 != (Node *)0x0; pNVar13 = pNVar13->parent) {
      if ((pNVar13->tag != (Dict *)0x0) && (pNVar13->tag->id == TidyTag_FORM)) {
        prvTidyReport(doc,element,(Node *)0x0,0x243);
        uVar7 = element->tag->model;
        break;
      }
    }
  }
  uVar15 = 0;
  if ((uVar7 >> 0xb & 1) != 0) {
    uVar15 = pLVar2->istackbase;
    pLVar2->istackbase = pLVar2->istacksize;
  }
  if ((uVar7 >> 0x11 & 1) == 0) {
    prvTidyInlineDup(doc,(Node *)0x0);
    uVar7 = element->tag->model;
  }
  pNVar9 = (Node *)0x0;
  pNVar13 = (Node *)(ulong)(mode + (mode == IgnoreWhitespace));
  if ((uVar7 & 0x410) != 0x10) {
    pNVar13 = pNVar9;
  }
  pNVar8 = prvTidyGetToken(doc,(GetTokenMode)pNVar13);
  if (pNVar8 != (Node *)0x0) {
    ppNVar1 = &element->content;
    bVar3 = true;
    pNVar9 = pNVar8;
    do {
      pDVar11 = pNVar9->tag;
      if (pNVar9->type == EndTag) {
        if (pDVar11 != (Dict *)0x0) {
          if ((pDVar11 == element->tag) || (element->was == pDVar11)) {
            prvTidyFreeNode(doc,pNVar9);
            if ((element->tag->model & 0x800) != 0) {
              while (pLVar2->istackbase < pLVar2->istacksize) {
                prvTidyPopInline(doc,(Node *)0x0);
              }
              pLVar2->istackbase = uVar15;
            }
            element->closed = yes;
            goto LAB_0013fdca;
          }
          goto LAB_0013f5fc;
        }
        goto LAB_0013f620;
      }
      if (pDVar11 == (Dict *)0x0) goto LAB_0013f6d6;
LAB_0013f5fc:
      TVar14 = pDVar11->id;
      if (((ulong)TVar14 < 0x31) && ((0x1400000010000U >> ((ulong)TVar14 & 0x3f) & 1) != 0)) {
        BVar5 = prvTidynodeIsElement(pNVar9);
        if (BVar5 != no) goto LAB_0013f620;
LAB_0013f635:
        prvTidyFreeNode(doc,pNVar9);
      }
      else {
        if (pNVar9->type == EndTag) {
          if (TVar14 == TidyTag_P) {
            pNVar9->type = StartEndTag;
            pNVar9->implicit = yes;
            goto LAB_0013f6d6;
          }
          if (TVar14 == TidyTag_BR) {
            pNVar9->type = StartTag;
            goto LAB_0013f6d6;
          }
          for (pNVar8 = element->parent; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->parent) {
            if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TVar14)) {
              prvTidyUngetToken(doc);
              goto LAB_0013fd34;
            }
          }
          if ((pLVar2->exiled == no) ||
             ((BVar5 = prvTidynodeHasCM(pNVar9,0x80), BVar5 == no &&
              ((pNVar9->tag == (Dict *)0x0 || (pNVar9->tag->id != TidyTag_TABLE))))))
          goto LAB_0013f6d6;
LAB_0013fdf0:
          prvTidyUngetToken(doc);
          goto LAB_0013fdca;
        }
LAB_0013f6d6:
        BVar5 = prvTidynodeIsText(pNVar9);
        if (BVar5 == no) {
          BVar5 = InsertMisc(element,pNVar9);
          if (BVar5 == no) {
            if (pNVar9->tag != (Dict *)0x0) {
              TVar14 = pNVar9->tag->id;
              if (TVar14 == TidyTag_AREA) {
                if ((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_MAP)) {
LAB_0013f7ce:
                  BVar5 = prvTidynodeIsElement(pNVar9);
                  if (BVar5 != no) {
                    pNVar9->parent = element;
                    pNVar8 = element->last;
                    pNVar9->prev = pNVar8;
                    ppNVar12 = &pNVar8->next;
                    if (pNVar8 == (Node *)0x0) {
                      ppNVar12 = ppNVar1;
                    }
                    *ppNVar12 = pNVar9;
                    element->last = pNVar9;
                    goto LAB_0013f640;
                  }
                }
              }
              else if (TVar14 == TidyTag_PARAM) {
                BVar5 = prvTidynodeHasCM(element,0x1000);
                if (BVar5 != no) goto LAB_0013f7ce;
              }
              else {
                BVar5 = prvTidynodeHasCM(pNVar9,0x10);
                if (BVar5 == no) {
                  BVar5 = prvTidynodeIsElement(pNVar9);
                  if (BVar5 == no) {
                    if ((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_FORM)) {
                      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
                    }
                    goto LAB_0013f620;
                  }
                  if (element->tag == (Dict *)0x0) {
LAB_0013f8c4:
                    BVar5 = prvTidynodeHasCM(pNVar9,8);
                    if (BVar5 != no) {
                      if (pLVar2->excludeBlocks == no) goto LAB_0013f815;
                      BVar5 = prvTidynodeHasCM(element,0x8000);
                      if (BVar5 == no) {
                        prvTidyReport(doc,element,pNVar9,0x259);
                      }
                      prvTidyUngetToken(doc);
                      BVar5 = prvTidynodeHasCM(element,0x800);
                      if (BVar5 != no) goto LAB_0013fe66;
                      goto LAB_0013fdca;
                    }
                    if ((pNVar9->tag->model & 4) != 0) goto LAB_0013fb42;
                    if ((((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_FORM)) &&
                        ((pNVar8 = element->parent, pNVar8 != (Node *)0x0 &&
                         ((pNVar8->tag != (Dict *)0x0 && (pNVar8->tag->id == TidyTag_TD)))))) &&
                       (pNVar8->implicit != no)) {
                      TVar14 = pNVar9->tag->id;
                      if (TVar14 == TidyTag_TH) {
                        prvTidyReport(doc,element,pNVar9,0x235);
                        prvTidyFreeNode(doc,pNVar9);
                        pNVar9 = element->parent;
                        (*doc->allocator->vtbl->free)(doc->allocator,pNVar9->element);
                        ptVar10 = prvTidytmbstrdup(doc->allocator,"th");
                        pNVar9->element = ptVar10;
                        pDVar11 = prvTidyLookupTagDef(TidyTag_TH);
                        pNVar9->tag = pDVar11;
                        goto LAB_0013f640;
                      }
                      if (TVar14 == TidyTag_TD) goto LAB_0013f620;
                    }
                    BVar5 = prvTidynodeHasCM(element,0x8000);
                    if ((BVar5 == no) && (element->implicit == no)) {
                      prvTidyReport(doc,element,pNVar9,0x259);
                    }
                    if ((*(int *)((doc->config).value + 0x3b) == 0) &&
                       (BVar5 = prvTidynodeHasCM(element,0x8000), BVar5 != no)) {
                      prvTidyReport(doc,element,pNVar9,0x25b);
                    }
                    prvTidyUngetToken(doc);
                    BVar5 = prvTidynodeHasCM(pNVar9,0x20);
                    if (BVar5 == no) {
                      BVar5 = prvTidynodeHasCM(pNVar9,0x40);
                      if (BVar5 == no) {
                        BVar5 = prvTidynodeHasCM(pNVar9,0x80);
                        if ((BVar5 == no) && (BVar5 = prvTidynodeHasCM(pNVar9,0x200), BVar5 == no))
                        {
                          BVar5 = prvTidynodeHasCM(element,0x800);
                          if (BVar5 != no) goto LAB_0013fec4;
                          goto LAB_0013fdca;
                        }
                        if (pLVar2->exiled != no) {
                          return;
                        }
                        TVar14 = TidyTag_TABLE;
                      }
                      else {
                        if (((element->parent != (Node *)0x0) &&
                            (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
                           (pDVar11->id == TidyTag_DL)) goto LAB_0013fdca;
                        TVar14 = TidyTag_DL;
                      }
                      pNVar9 = prvTidyInferredTag(doc,TVar14);
                    }
                    else {
                      if (((element->parent != (Node *)0x0) &&
                          (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
                         (pDVar11->parser == prvTidyParseList)) goto LAB_0013fdca;
                      pNVar9 = prvTidyInferredTag(doc,TidyTag_UL);
                      AddClassNoIndent(doc,pNVar9);
                    }
                  }
                  else {
                    TVar14 = element->tag->id;
                    if ((TVar14 != TidyTag_TH) && (TVar14 != TidyTag_TD)) {
                      if ((TVar14 == TidyTag_LI) &&
                         (((pNVar9->tag != (Dict *)0x0 &&
                           (uVar7 = pNVar9->tag->id - TidyTag_FRAME, uVar7 < 0x2a)) &&
                          ((0x30000000003U >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) goto LAB_0013f620;
                      goto LAB_0013f8c4;
                    }
                    BVar5 = prvTidynodeHasCM(pNVar9,4);
                    if (BVar5 != no) {
LAB_0013fb42:
                      MoveToHead(doc,element,pNVar9);
                      goto LAB_0013f640;
                    }
                    BVar5 = prvTidynodeHasCM(pNVar9,0x20);
                    if (BVar5 == no) {
                      BVar5 = prvTidynodeHasCM(pNVar9,0x40);
                      if (BVar5 != no) {
                        prvTidyUngetToken(doc);
                        pNVar9 = prvTidyInferredTag(doc,TidyTag_DL);
                        goto LAB_0013fc20;
                      }
                    }
                    else {
                      prvTidyUngetToken(doc);
                      pNVar9 = prvTidyInferredTag(doc,TidyTag_UL);
                      AddClassNoIndent(doc,pNVar9);
LAB_0013fc20:
                      pLVar2->excludeBlocks = yes;
                    }
                    BVar5 = prvTidynodeHasCM(pNVar9,8);
                    if (BVar5 == no) goto LAB_0013fdf0;
                  }
                  if (pNVar9 != (Node *)0x0) goto LAB_0013f815;
                  bVar4 = true;
                  pNVar9 = (Node *)0x0;
                }
                else {
LAB_0013f815:
                  if (((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_A)) &&
                     (pNVar9->implicit == no)) {
                    pDVar11 = element->tag;
                    if ((pDVar11 != (Dict *)0x0) && (pDVar11->id == TidyTag_A)) {
LAB_0013f967:
                      if ((pNVar9->type != EndTag) &&
                         ((pNVar9->attributes == (AttVal *)0x0 &&
                          (*(int *)((doc->config).value + 9) != 0)))) {
                        pNVar9->type = EndTag;
                        prvTidyReport(doc,element,pNVar9,0x232);
                        prvTidyUngetToken(doc);
                        goto LAB_0013f640;
                      }
                      if ((pDVar11 == (Dict *)0x0) || (pDVar11->id != TidyTag_A)) {
                        prvTidyReport(doc,element,pNVar9,0x235);
                        prvTidyFreeNode(doc,pNVar9);
                      }
                      else {
                        prvTidyReport(doc,element,pNVar9,0x259);
                        prvTidyUngetToken(doc);
                      }
                      if (((ulong)pNVar13 & 2) != 0) {
                        return;
                      }
                      goto LAB_0013fdca;
                    }
                    for (pNVar8 = element->parent; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->parent) {
                      if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_A))
                      goto LAB_0013f967;
                    }
                  }
                  bVar4 = false;
                }
                BVar5 = prvTidynodeIsElement(pNVar9);
                if (BVar5 != no) {
                  if ((pNVar9->tag->model & 0x10) == 0) {
                    bVar3 = true;
                    local_3c = 0;
                  }
                  else if (bVar3) {
                    if (pNVar9->implicit == no) {
                      local_3c = 1;
                      if ((element->tag->model & 0x20000) != 0) goto LAB_0013fb7f;
                      iVar6 = prvTidyInlineDup(doc,pNVar9);
                      bVar3 = false;
                      if (0 < iVar6) goto LAB_0013f640;
                    }
                    else {
                      local_3c = 1;
                      bVar3 = true;
                    }
                  }
                  else {
LAB_0013fb7f:
                    local_3c = 1;
                    bVar3 = false;
                  }
                  if (((!bVar4) && (pNVar9->tag != (Dict *)0x0)) && (pNVar9->tag->id == TidyTag_BR))
                  {
                    TrimSpaces(doc,element);
                  }
                  pNVar9->parent = element;
                  pNVar13 = element->last;
                  pNVar9->prev = pNVar13;
                  ppNVar12 = &pNVar13->next;
                  if (pNVar13 == (Node *)0x0) {
                    ppNVar12 = ppNVar1;
                  }
                  *ppNVar12 = pNVar9;
                  element->last = pNVar9;
                  if (pNVar9->implicit != no) {
                    prvTidyReport(doc,element,pNVar9,0x247);
                  }
                  ParseTag(doc,pNVar9,IgnoreWhitespace);
                  pNVar13 = (Node *)(ulong)local_3c;
                  goto LAB_0013f640;
                }
                if (pNVar9->type == EndTag) {
                  prvTidyPopInline(doc,pNVar9);
                }
              }
            }
LAB_0013f620:
            prvTidyReport(doc,element,pNVar9,0x235);
            goto LAB_0013f635;
          }
        }
        else {
          if ((bVar3) && ((element->tag->model & 0x20000) == 0)) {
            iVar6 = prvTidyInlineDup(doc,pNVar9);
            bVar3 = false;
            if (0 < iVar6) goto LAB_0013f640;
          }
          pNVar9->parent = element;
          pNVar13 = element->last;
          pNVar9->prev = pNVar13;
          ppNVar12 = &pNVar13->next;
          if (pNVar13 == (Node *)0x0) {
            ppNVar12 = ppNVar1;
          }
          *ppNVar12 = pNVar9;
          element->last = pNVar9;
          bVar4 = false;
          pNVar13 = (Node *)0x1;
          bVar3 = false;
          if (((element->tag != (Dict *)0x0) &&
              (uVar7 = element->tag->id - TidyTag_BLOCKQUOTE, bVar3 = bVar4, uVar7 < 0x3d)) &&
             ((0x1002000000400003U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
            prvTidyConstrainVersion(doc,0xfffffedb);
          }
        }
      }
LAB_0013f640:
      pNVar9 = prvTidyGetToken(doc,(GetTokenMode)pNVar13);
    } while (pNVar9 != (Node *)0x0);
    pNVar9 = (Node *)0x0;
  }
LAB_0013fd34:
  uVar7 = element->tag->model;
  if (-1 < (short)uVar7) {
    prvTidyReport(doc,element,pNVar9,0x25a);
    uVar7 = element->tag->model;
  }
  if ((uVar7 >> 0xb & 1) != 0) {
    while (pLVar2->istackbase < pLVar2->istacksize) {
      prvTidyPopInline(doc,(Node *)0x0);
    }
    pLVar2->istackbase = uVar15;
  }
LAB_0013fdca:
  TrimSpaces(doc,element);
  return;
LAB_0013fec4:
  while (pLVar2->istackbase < pLVar2->istacksize) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
LAB_0013fe66:
  pLVar2->istackbase = uVar15;
  goto LAB_0013fdca;
}

Assistant:

void TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_block = 0;
    static int parse_block_cnt = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack = yes;
    uint istackbase = 0;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_block++;
    parse_block_cnt++;
    SPRTF("Entering ParseBlock %d... %d %s\n",in_parse_block,parse_block_cnt,
        ((element && element->element) ? element->element : ""));
#endif

    if ( element->tag->model & CM_EMPTY ) {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_block--;
        SPRTF("Exit ParseBlockL 1 %d...\n",in_parse_block);
#endif
        return;
    }

    if ( nodeIsFORM(element) && 
         DescendantOf(element, TidyTag_FORM) )
        TY_(Report)(doc, element, NULL, ILLEGAL_NESTING );

    /*
     InlineDup() asks the lexer to insert inline emphasis tags
     currently pushed on the istack, but take care to avoid
     propagating inline emphasis inside OBJECT or APPLET.
     For these elements a fresh inline stack context is created
     and disposed of upon reaching the end of the element.
     They thus behave like table cells in this respect.
    */
    if (element->tag->model & CM_OBJECT)
    {
        istackbase = lexer->istackbase;
        lexer->istackbase = lexer->istacksize;
    }

    if (!(element->tag->model & CM_MIXED))
        TY_(InlineDup)( doc, NULL );

    /*\
     *  Issue #212 - If it is likely that it may be necessary
     *  to move a leading space into a text node before this
     *  element, then keep the mode MixedContent to keep any
     *  leading space
    \*/
    if ( !(element->tag->model & CM_INLINE) ||
          (element->tag->model & CM_FIELD ) )
    {
        mode = IgnoreWhitespace;
    }
    else if (mode == IgnoreWhitespace)
    {
        /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
           when such a leading space may need to be inserted before this element to 
           preverve the browser view */
        mode = MixedContent;
    }

    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
            in_parse_block--;
            SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
            return;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /* 
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            mode = MixedContent;

            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 3 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 4 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else /* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                
                /* #521, warn on missing optional end-tags if not omitting them. */
                if ( cfgBool( doc, TidyOmitOptionalTags ) == no && TY_(nodeHasCM)(element, CM_OPT) )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_OPTIONAL );


                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 5 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 6 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can 
                       continue. */
                    if (lexer->exiled) {
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 7 %d...\n",in_parse_block);
#endif
                        return;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 8 %d...\n",in_parse_block);
#endif
                    return;

                }
                else
                {
                    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 9 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            else
            {
                /* Issue #597 - if we not 'UngetToken' then it is being discarded.
                   Add message, and 'FreeNode' - thanks @ralfjunker */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_block--;
            SPRTF("Exit ParseBlock 9b %d...\n",in_parse_block);
#endif
            return;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);
            
            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an 
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */
            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
    in_parse_block--;
    SPRTF("Exit ParseBlock 10 %d...\n",in_parse_block);
#endif
}